

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *in_RDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiContext *g;
  bool in_stack_0000001f;
  ImGuiWindow *in_stack_00000020;
  ImGuiID local_14;
  ImGuiWindow *local_8;
  
  pIVar2 = GImGui;
  if (GImGui->NavWindow != in_RDI) {
    GImGui->NavWindow = in_RDI;
    if ((in_RDI != (ImGuiWindow *)0x0) && ((pIVar2->NavDisableMouseHover & 1U) != 0)) {
      pIVar2->NavMousePosDirty = true;
    }
    pIVar2->NavInitRequest = false;
    if (in_RDI == (ImGuiWindow *)0x0) {
      local_14 = 0;
    }
    else {
      local_14 = in_RDI->NavLastIds[0];
    }
    pIVar2->NavId = local_14;
    pIVar2->NavIdIsAlive = false;
    pIVar2->NavLayer = ImGuiNavLayer_Main;
  }
  ClosePopupsOverWindow(in_stack_00000020,in_stack_0000001f);
  if (in_RDI != (ImGuiWindow *)0x0) {
    in_RDI->LastFrameJustFocused = pIVar2->FrameCount;
    if ((in_RDI->DockNode != (ImGuiDockNode *)0x0) &&
       (in_RDI->DockNode->TabBar != (ImGuiTabBar *)0x0)) {
      IVar1 = in_RDI->ID;
      in_RDI->DockNode->TabBar->NextSelectedTabId = IVar1;
      in_RDI->DockNode->TabBar->SelectedTabId = IVar1;
    }
    local_8 = in_RDI;
    if (in_RDI->RootWindow != (ImGuiWindow *)0x0) {
      local_8 = in_RDI->RootWindow;
    }
    if (((((local_8->Flags & 0x4000000U) != 0) && (pIVar2->ActiveId != 0)) &&
        (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       (pIVar2->ActiveIdWindow->RootWindow != local_8)) {
      ClearActiveID();
    }
    BringWindowToFocusFront(unaff_retaddr);
    if ((local_8->Flags & 0x2000U) == 0) {
      BringWindowToDisplayFront(window);
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavInitRequest = false;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavIdIsAlive = false;
        g.NavLayer = ImGuiNavLayer_Main;
        //IMGUI_DEBUG_LOG("FocusWindow(\"%s\")\n", window ? window->Name : NULL);
    }

    // Close popups if any
    ClosePopupsOverWindow(window, false);

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;
    window->LastFrameJustFocused = g.FrameCount;

    // Select in dock node
    if (window->DockNode && window->DockNode->TabBar)
        window->DockNode->TabBar->SelectedTabId = window->DockNode->TabBar->NextSelectedTabId = window->ID;

    // Move the root window to the top of the pile
    if (window->RootWindow)
        window = window->RootWindow;

    // Steal focus on active widgets
    if (window->Flags & ImGuiWindowFlags_Popup) // FIXME: This statement should be unnecessary. Need further testing before removing it..
        if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != window)
            ClearActiveID();

    // Bring to front
    BringWindowToFocusFront(window);
    if (!(window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus))
        BringWindowToDisplayFront(window);
}